

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention::forward_int8
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  uint uVar1;
  Mat *blob;
  size_t sVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar3;
  int j_1;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  float *pfVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  void *pvVar12;
  int i_4;
  int iVar13;
  int j_2;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  int sum;
  ulong uVar20;
  int j;
  int j_4;
  long lVar21;
  void *pvVar22;
  long lVar23;
  int sum_1;
  void *pvVar24;
  Mat *pMVar25;
  Mat *blob_00;
  void *pvVar26;
  ulong uVar27;
  ulong uVar28;
  int i_3;
  ulong uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  long local_500;
  Mat *local_4e0;
  void *local_4c8;
  float xkm_int8_scale;
  float v_blob_int8_scale;
  float k_blob_int8_scale;
  float q_blob_int8_scale;
  int *local_4b0;
  Mat m;
  long *local_458;
  int local_44c;
  Mat m_1;
  long local_400;
  Mat local_3f8;
  long local_3a8;
  ulong local_3a0;
  ulong local_398;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_390;
  Mat local_388;
  Mat local_338;
  Mat local_2e8;
  Mat local_298;
  Mat *local_248;
  int *local_240;
  Mat local_238;
  Mat local_1e8;
  Mat local_198;
  Mat local_148;
  Mat local_f8;
  Mat local_a8;
  long local_60;
  long local_58;
  long local_50;
  void *local_48;
  long local_40;
  ulong local_38;
  
  blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start;
  lVar4 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)blob;
  local_4e0 = blob;
  if (lVar4 == 0x48) {
    iVar14 = this->attn_mask;
    pMVar25 = blob;
LAB_004b5568:
    blob_00 = pMVar25;
    if (iVar14 == 0) {
      local_4c8 = (void *)0x0;
      local_4b0 = (int *)0x0;
      local_500 = 0;
      local_458 = (long *)0x0;
      local_44c = 0;
      iVar14 = 0;
      local_400 = 0;
      goto LAB_004b5637;
    }
  }
  else {
    iVar14 = this->attn_mask;
    pMVar25 = blob + 1;
    blob_00 = blob;
    if (iVar14 == 0 || lVar4 != 0x90) {
      local_4e0 = pMVar25;
      if (iVar14 == 0) {
        local_4e0 = blob + 2;
      }
      if (lVar4 != 0xd8) {
        local_4e0 = blob + 2;
      }
      if (lVar4 == 0x90) {
        local_4e0 = pMVar25;
      }
      goto LAB_004b5568;
    }
  }
  local_4c8 = *(void **)((long)blob + lVar4 + -0x48);
  local_4b0 = *(int **)((long)blob + lVar4 + -0x40);
  local_500 = *(long *)((long)blob + lVar4 + -0x38);
  local_458 = *(long **)((long)blob + lVar4 + -0x28);
  local_44c = *(int *)((long)blob + lVar4 + -0x20);
  iVar14 = *(int *)((long)blob + lVar4 + -0x1c);
  local_400 = *(long *)((long)blob + lVar4 + -8);
  if (local_4b0 == (int *)0x0) {
    local_4b0 = (int *)0x0;
  }
  else {
    LOCK();
    *local_4b0 = *local_4b0 + 1;
    UNLOCK();
  }
LAB_004b5637:
  local_240 = &this->attn_mask;
  _h = blob->h;
  uVar1 = blob_00->h;
  uVar6 = (long)this->embed_dim / (long)this->num_heads;
  uVar16 = this->weight_data_size / this->embed_dim;
  pMVar25 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_390 = bottom_blobs;
  Mat::create(pMVar25,uVar16,_h,4,opt->blob_allocator);
  iVar15 = -100;
  if ((pMVar25->data != (void *)0x0) && ((long)pMVar25->c * pMVar25->cstep != 0)) {
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    iVar9 = (int)uVar6;
    local_248 = pMVar25;
    Mat::create(&local_f8,iVar9,_h,this->num_heads,4,opt->workspace_allocator);
    iVar15 = -100;
    if ((local_f8.data != (void *)0x0) && ((long)local_f8.c * local_f8.cstep != 0)) {
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      Mat::create(&local_a8,iVar9,uVar1,this->num_heads,4,opt->workspace_allocator);
      iVar15 = -100;
      if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
        local_148.cstep = 0;
        local_148.data = (void *)0x0;
        local_148.refcount._0_4_ = 0;
        local_148.refcount._4_4_ = 0;
        local_148.elemsize._0_4_ = 0;
        local_148.elemsize._4_4_ = 0;
        local_148.elempack = 0;
        local_148.allocator = (Allocator *)0x0;
        local_148.dims = 0;
        local_148.w = 0;
        local_148.h = 0;
        local_148.d = 0;
        local_148.c = 0;
        Mat::create(&local_148,uVar1,iVar9,this->num_heads,4,opt->workspace_allocator);
        iVar15 = -100;
        if ((local_148.data != (void *)0x0) && ((long)local_148.c * local_148.cstep != 0)) {
          local_338.cstep = 0;
          local_338.data = (void *)0x0;
          local_338.refcount._0_4_ = 0;
          local_338.refcount._4_4_ = 0;
          local_338.elemsize._0_4_ = 0;
          local_338.elemsize._4_4_ = 0;
          local_338.elempack = 0;
          local_338.allocator = (Allocator *)0x0;
          local_338.dims = 0;
          local_338.w = 0;
          local_338.h = 0;
          local_338.d = 0;
          local_338.c = 0;
          Mat::create(&local_338,uVar1,_h,this->num_heads,4,opt->workspace_allocator);
          iVar15 = -100;
          if ((local_338.data != (void *)0x0) && ((long)local_338.c * local_338.cstep != 0)) {
            local_198.cstep = 0;
            local_198.data = (void *)0x0;
            local_198.refcount._0_4_ = 0;
            local_198.refcount._4_4_ = 0;
            local_198.elemsize._0_4_ = 0;
            local_198.elemsize._4_4_ = 0;
            local_198.elempack = 0;
            local_198.allocator = (Allocator *)0x0;
            local_198.dims = 0;
            local_198.w = 0;
            local_198.h = 0;
            local_198.d = 0;
            local_198.c = 0;
            Mat::create(&local_198,iVar9,this->num_heads,_h,4,opt->workspace_allocator);
            iVar15 = -100;
            if ((local_198.data != (void *)0x0) && ((long)local_198.c * local_198.cstep != 0)) {
              local_238.cstep = 0;
              local_238.data = (void *)0x0;
              local_238.refcount._0_4_ = 0;
              local_238.refcount._4_4_ = 0;
              local_238.elemsize._0_4_ = 0;
              local_238.elemsize._4_4_ = 0;
              local_238.elempack = 0;
              local_238.allocator = (Allocator *)0x0;
              local_238.dims = 0;
              local_238.w = 0;
              local_238.h = 0;
              local_238.d = 0;
              local_238.c = 0;
              dynamic_quantize_2d(blob,&local_238,&q_blob_int8_scale,opt);
              pvVar3 = local_390;
              local_388.cstep = 0;
              local_388.data = (void *)0x0;
              local_388.refcount._0_4_ = 0;
              local_388.refcount._4_4_ = 0;
              local_388.elemsize._0_4_ = 0;
              local_388.elemsize._4_4_ = 0;
              local_388.elempack = 0;
              local_388.allocator = (Allocator *)0x0;
              local_388.dims = 0;
              local_388.w = 0;
              local_388.h = 0;
              local_388.d = 0;
              local_388.c = 0;
              if ((long)(local_390->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_390->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start == 0x48) {
                piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                local_388.data = local_238.data;
                local_388.refcount._0_4_ = local_238.refcount._0_4_;
                local_388.refcount._4_4_ = local_238.refcount._4_4_;
                local_388.elemsize._0_4_ = (undefined4)local_238.elemsize;
                local_388.elemsize._4_4_ = local_238.elemsize._4_4_;
                local_388.elempack = local_238.elempack;
                local_388.allocator = local_238.allocator;
                local_388.dims = local_238.dims;
                local_388.w = local_238.w;
                local_388.h = local_238.h;
                local_388.d = local_238.d;
                local_388.c = local_238.c;
                local_388.cstep = local_238.cstep;
                k_blob_int8_scale = q_blob_int8_scale;
              }
              else {
                dynamic_quantize_2d(blob_00,&local_388,&k_blob_int8_scale,opt);
              }
              local_3f8.cstep = 0;
              local_3f8.data = (void *)0x0;
              local_3f8.refcount._0_4_ = 0;
              local_3f8.refcount._4_4_ = 0;
              local_3f8.elemsize._0_4_ = 0;
              local_3f8.elemsize._4_4_ = 0;
              local_3f8.elempack = 0;
              local_3f8.allocator = (Allocator *)0x0;
              local_3f8.dims = 0;
              local_3f8.w = 0;
              local_3f8.h = 0;
              local_3f8.d = 0;
              local_3f8.c = 0;
              lVar4 = ((long)(pvVar3->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar3->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start) / 0x48;
              if (lVar4 == 2) {
                piVar5 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                local_3f8.data = local_388.data;
                local_3f8.refcount._0_4_ = local_388.refcount._0_4_;
                local_3f8.refcount._4_4_ = local_388.refcount._4_4_;
                local_3f8.elemsize._0_4_ = (undefined4)local_388.elemsize;
                local_3f8.elemsize._4_4_ = local_388.elemsize._4_4_;
                local_3f8.elempack = local_388.elempack;
                local_3f8.allocator = local_388.allocator;
                local_3f8.dims = local_388.dims;
                local_3f8.w = local_388.w;
                local_3f8.h = local_388.h;
                local_3f8.d = local_388.d;
                local_3f8.c = local_388.c;
                local_3f8.cstep = local_388.cstep;
                v_blob_int8_scale = k_blob_int8_scale;
              }
              else if (lVar4 == 1) {
                piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + 1;
                  UNLOCK();
                }
                local_3f8.data = local_238.data;
                local_3f8.refcount._0_4_ = local_238.refcount._0_4_;
                local_3f8.refcount._4_4_ = local_238.refcount._4_4_;
                local_3f8.elemsize._0_4_ = (undefined4)local_238.elemsize;
                local_3f8.elemsize._4_4_ = local_238.elemsize._4_4_;
                local_3f8.elempack = local_238.elempack;
                local_3f8.allocator = local_238.allocator;
                local_3f8.dims = local_238.dims;
                local_3f8.w = local_238.w;
                local_3f8.h = local_238.h;
                local_3f8.d = local_238.d;
                local_3f8.c = local_238.c;
                local_3f8.cstep = local_238.cstep;
                v_blob_int8_scale = q_blob_int8_scale;
              }
              else {
                dynamic_quantize_2d(local_4e0,&local_3f8,&v_blob_int8_scale,opt);
              }
              uVar28 = 0;
              if (0 < (int)uVar16) {
                uVar28 = (ulong)uVar16;
              }
              uVar27 = 0;
              if (0 < iVar9) {
                uVar27 = uVar6 & 0xffffffff;
              }
              uVar6 = 0;
              if (0 < (int)_h) {
                uVar6 = (ulong)_h;
              }
              local_390 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(long)(int)uVar16;
              uVar20 = (ulong)uVar1;
              if ((int)uVar1 < 1) {
                uVar20 = 0;
              }
              local_58 = (long)iVar9;
              local_60 = local_58 * (long)local_390;
              local_50 = iVar14 * local_500;
              local_3a0 = 0;
              local_3a8 = 0;
              for (lVar4 = 0; pvVar26 = local_338.data, lVar4 < this->num_heads; lVar4 = lVar4 + 1)
              {
                lVar10 = lVar4 * local_58;
                for (uVar17 = 0; uVar17 != uVar6; uVar17 = uVar17 + 1) {
                  pvVar19 = (this->q_bias_data).data;
                  pvVar12 = (this->q_weight_data_int8_scales).data;
                  lVar21 = (long)(this->q_weight_data).data + local_3a8;
                  for (uVar29 = 0; uVar29 != uVar27; uVar29 = uVar29 + 1) {
                    iVar14 = 0;
                    for (lVar7 = 0; (int)uVar28 != (int)lVar7; lVar7 = lVar7 + 1) {
                      iVar14 = iVar14 + (int)*(char *)(lVar21 + lVar7) *
                                        (int)*(char *)((long)local_238.data +
                                                      lVar7 + CONCAT44(local_238.elemsize._4_4_,
                                                                       (undefined4)
                                                                       local_238.elemsize) * uVar17
                                                              * (long)local_238.w);
                    }
                    *(float *)((long)local_f8.data +
                              uVar29 * 4 +
                              (long)local_f8.w *
                              CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) *
                              uVar17 + local_f8.cstep * lVar4 *
                                       CONCAT44(local_f8.elemsize._4_4_,
                                                (undefined4)local_f8.elemsize)) =
                         ((float)iVar14 /
                          (*(float *)((long)pvVar12 + (uVar29 + lVar10) * 4) * q_blob_int8_scale) +
                         *(float *)((long)pvVar19 + (uVar29 + lVar10) * 4)) * this->scale;
                    lVar21 = (long)&(local_390->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar21;
                  }
                }
                pfVar8 = (float *)(local_a8.cstep * lVar4 *
                                   CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) +
                                  (long)local_a8.data);
                uVar1 = local_388.h;
                if (local_388.h < 1) {
                  uVar1 = 0;
                }
                for (uVar17 = 0; uVar17 != uVar1; uVar17 = uVar17 + 1) {
                  iVar14 = this->kdim;
                  pvVar19 = (this->k_bias_data).data;
                  pvVar12 = (this->k_weight_data_int8_scales).data;
                  iVar15 = 0;
                  if (0 < iVar14) {
                    iVar15 = iVar14;
                  }
                  pvVar24 = (void *)(local_3a0 * (long)iVar14 + (long)(this->k_weight_data).data);
                  for (uVar29 = 0; uVar29 != uVar27; uVar29 = uVar29 + 1) {
                    iVar9 = 0;
                    for (lVar21 = 0; iVar15 != (int)lVar21; lVar21 = lVar21 + 1) {
                      iVar9 = iVar9 + (int)*(char *)((long)pvVar24 + lVar21) *
                                      (int)*(char *)((long)local_388.data +
                                                    lVar21 + CONCAT44(local_388.elemsize._4_4_,
                                                                      (undefined4)local_388.elemsize
                                                                     ) * uVar17 * (long)local_388.w)
                      ;
                    }
                    *pfVar8 = (float)iVar9 /
                              (k_blob_int8_scale * *(float *)((long)pvVar12 + (uVar29 + lVar10) * 4)
                              ) + *(float *)((long)pvVar19 + (uVar29 + lVar10) * 4);
                    pfVar8 = pfVar8 + 1;
                    pvVar24 = (void *)((long)pvVar24 + (long)iVar14);
                  }
                }
                local_48 = (void *)(local_148.cstep * lVar4 *
                                    CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize
                                            ) + (long)local_148.data);
                local_40 = (long)local_148.w *
                           CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                uVar16 = local_3f8.h;
                if (local_3f8.h < 1) {
                  uVar16 = 0;
                }
                uVar17 = 0;
                uVar29 = local_3a0;
                local_398 = (ulong)uVar1;
                while (uVar18 = uVar29, uVar11 = uVar17, uVar11 != uVar27) {
                  pfVar8 = (float *)(local_40 * uVar11 + (long)local_48);
                  iVar14 = this->vdim;
                  pvVar19 = (this->v_bias_data).data;
                  pvVar12 = (this->v_weight_data_int8_scales).data;
                  iVar15 = 0;
                  if (0 < iVar14) {
                    iVar15 = iVar14;
                  }
                  pvVar24 = (this->v_weight_data).data;
                  pvVar22 = local_3f8.data;
                  for (uVar17 = 0; uVar17 != uVar16; uVar17 = uVar17 + 1) {
                    iVar9 = 0;
                    for (lVar21 = 0; iVar15 != (int)lVar21; lVar21 = lVar21 + 1) {
                      iVar9 = iVar9 + (int)*(char *)((long)pvVar24 + lVar21 + (long)iVar14 * uVar18)
                                      * (int)*(char *)((long)pvVar22 + lVar21);
                    }
                    *pfVar8 = (float)iVar9 /
                              (*(float *)((long)pvVar12 + (uVar11 + lVar10) * 4) * v_blob_int8_scale
                              ) + *(float *)((long)pvVar19 + (uVar11 + lVar10) * 4);
                    pfVar8 = pfVar8 + 1;
                    pvVar22 = (void *)((long)pvVar22 +
                                      (long)local_3f8.w *
                                      CONCAT44(local_3f8.elemsize._4_4_,
                                               (undefined4)local_3f8.elemsize));
                  }
                  uVar29 = uVar18 + 1;
                  local_398 = uVar18;
                  local_38 = uVar11;
                  uVar17 = uVar11 + 1;
                }
                uVar17 = CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
                m.data = (void *)(local_f8.cstep * lVar4 * uVar17 + (long)local_f8.data);
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = (undefined4)local_f8.elemsize;
                m.elemsize._4_4_ = local_f8.elemsize._4_4_;
                m.elempack = local_f8.elempack;
                m.allocator = local_f8.allocator;
                m.w = local_f8.w;
                m.h = local_f8.h;
                m.c = local_f8.d;
                m.d = 1;
                m.dims = local_f8.dims + -1;
                m.cstep = (uVar17 * (long)local_f8.h * (long)local_f8.w + 0xf & 0xfffffffffffffff0)
                          / uVar17;
                if (local_f8.dims == 4) {
                  m.cstep = (long)local_f8.h * (long)local_f8.w;
                }
                uVar17 = CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                m_1.data = (void *)(local_a8.cstep * lVar4 * uVar17 + (long)local_a8.data);
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = (undefined4)local_a8.elemsize;
                m_1.elemsize._4_4_ = local_a8.elemsize._4_4_;
                m_1.elempack = local_a8.elempack;
                m_1.allocator = local_a8.allocator;
                m_1.w = local_a8.w;
                m_1.h = local_a8.h;
                m_1.c = local_a8.d;
                m_1.d = 1;
                m_1.dims = local_a8.dims + -1;
                m_1.cstep = (uVar17 * (long)local_a8.h * (long)local_a8.w + 0xf & 0xfffffffffffffff0
                            ) / uVar17;
                if (local_a8.dims == 4) {
                  m_1.cstep = (long)local_a8.h * (long)local_a8.w;
                }
                lVar21 = local_338.cstep * lVar4;
                lVar10 = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
                local_298.cstep = 0;
                lVar7 = (long)local_338.w;
                local_298.data = (void *)0x0;
                local_298.refcount._0_4_ = 0;
                local_298.refcount._4_4_ = 0;
                local_298.elemsize._0_4_ = 0;
                local_298.elemsize._4_4_ = 0;
                local_298.elempack = 0;
                local_298.h = 0;
                local_298.d = 0;
                local_298.c = 0;
                local_298.allocator = (Allocator *)0x0;
                local_298.dims = 0;
                local_298.w = 0;
                local_1e8.cstep = 0;
                local_1e8.data = (void *)0x0;
                local_1e8.refcount._0_4_ = 0;
                local_1e8.refcount._4_4_ = 0;
                local_1e8.elemsize._0_4_ = 0;
                local_1e8._20_8_ = 0;
                local_1e8.h = 0;
                local_1e8.d = 0;
                local_1e8.c = 0;
                local_1e8.allocator = (Allocator *)0x0;
                local_1e8.dims = 0;
                local_1e8.w = 0;
                dynamic_quantize_2d_per_h(&m,&local_298,&local_1e8,opt);
                local_2e8.cstep = 0;
                local_2e8.data = (void *)0x0;
                local_2e8.refcount._0_4_ = 0;
                local_2e8.refcount._4_4_ = 0;
                local_2e8.elemsize._0_4_ = 0;
                local_2e8.elemsize._4_4_ = 0;
                local_2e8.elempack = 0;
                local_2e8.h = 0;
                local_2e8.d = 0;
                local_2e8.c = 0;
                local_2e8.allocator = (Allocator *)0x0;
                local_2e8.dims = 0;
                local_2e8.w = 0;
                dynamic_quantize_2d(&m_1,&local_2e8,&xkm_int8_scale,opt);
                for (uVar17 = 0; uVar17 != uVar6; uVar17 = uVar17 + 1) {
                  fVar31 = *(float *)((long)local_1e8.data + uVar17 * 4);
                  pvVar19 = local_2e8.data;
                  for (uVar29 = 0; uVar29 != uVar20; uVar29 = uVar29 + 1) {
                    iVar14 = 0;
                    for (lVar23 = 0; (int)uVar27 != (int)lVar23; lVar23 = lVar23 + 1) {
                      iVar14 = iVar14 + (int)*(char *)((long)pvVar19 + lVar23) *
                                        (int)*(char *)((long)local_298.data +
                                                      lVar23 + CONCAT44(local_298.elemsize._4_4_,
                                                                        (undefined4)
                                                                        local_298.elemsize) * uVar17
                                                               * (long)local_298.w);
                    }
                    *(float *)((long)pvVar26 +
                              uVar29 * 4 + lVar10 * lVar7 * uVar17 + lVar21 * lVar10) =
                         (float)iVar14 * (1.0 / (fVar31 * xkm_int8_scale));
                    pvVar19 = (void *)((long)pvVar19 +
                                      (long)local_2e8.w *
                                      CONCAT44(local_2e8.elemsize._4_4_,
                                               (undefined4)local_2e8.elemsize));
                  }
                }
                piVar5 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (local_2e8.allocator == (Allocator *)0x0) {
                      free(local_2e8.data);
                    }
                    else {
                      (*(local_2e8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (local_1e8.allocator == (Allocator *)0x0) {
                      free(local_1e8.data);
                    }
                    else {
                      (*(local_1e8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (local_298.allocator == (Allocator *)0x0) {
                      free(local_298.data);
                    }
                    else {
                      (*(local_298.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (m_1.allocator == (Allocator *)0x0) {
                      free(m_1.data);
                    }
                    else {
                      (*(m_1.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (m.allocator == (Allocator *)0x0) {
                      free(m.data);
                    }
                    else {
                      (*(m.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if (*local_240 != 0) {
                  if (local_44c == 3) {
                    piVar5 = (int *)0x0;
                    pvVar26 = (void *)(local_400 * local_500 * lVar4 + (long)local_4c8);
                  }
                  else {
                    pvVar26 = local_4c8;
                    if (local_4b0 == (int *)0x0) {
                      piVar5 = (int *)0x0;
                    }
                    else {
                      LOCK();
                      *local_4b0 = *local_4b0 + 1;
                      UNLOCK();
                      piVar5 = local_4b0;
                    }
                  }
                  pvVar12 = (void *)(CONCAT44(local_338.elemsize._4_4_,
                                              (undefined4)local_338.elemsize) * local_338.cstep *
                                     lVar4 + (long)local_338.data);
                  pvVar19 = pvVar26;
                  for (uVar17 = 0; uVar17 != uVar6; uVar17 = uVar17 + 1) {
                    for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                      *(float *)((long)pvVar12 + uVar29 * 4) =
                           *(float *)((long)pvVar12 + uVar29 * 4) +
                           *(float *)((long)pvVar19 + uVar29 * 4);
                    }
                    pvVar12 = (void *)((long)pvVar12 +
                                      (long)local_338.w *
                                      CONCAT44(local_338.elemsize._4_4_,
                                               (undefined4)local_338.elemsize));
                    pvVar19 = (void *)((long)pvVar19 + local_50);
                  }
                  if (piVar5 != (int *)0x0) {
                    LOCK();
                    *piVar5 = *piVar5 + -1;
                    UNLOCK();
                    if (*piVar5 == 0) {
                      if (local_458 == (long *)0x0) {
                        free(pvVar26);
                      }
                      else {
                        (**(code **)(*local_458 + 0x18))();
                      }
                    }
                  }
                }
                lVar21 = (long)local_338.w;
                lVar10 = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
                pvVar26 = (void *)(lVar10 * local_338.cstep * lVar4 + (long)local_338.data);
                for (uVar17 = 0; uVar17 != uVar6; uVar17 = uVar17 + 1) {
                  fVar31 = -3.4028235e+38;
                  for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                    fVar32 = *(float *)((long)pvVar26 + uVar29 * 4);
                    if (fVar31 <= fVar32) {
                      fVar31 = fVar32;
                    }
                  }
                  fVar32 = 0.0;
                  for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                    fVar30 = expf(*(float *)((long)pvVar26 + uVar29 * 4) - fVar31);
                    *(float *)((long)pvVar26 + uVar29 * 4) = fVar30;
                    fVar32 = fVar32 + fVar30;
                  }
                  for (uVar29 = 0; uVar20 != uVar29; uVar29 = uVar29 + 1) {
                    *(float *)((long)pvVar26 + uVar29 * 4) =
                         *(float *)((long)pvVar26 + uVar29 * 4) * (1.0 / fVar32);
                  }
                  pvVar26 = (void *)((long)pvVar26 + lVar21 * lVar10);
                }
                uVar17 = CONCAT44(local_338.elemsize._4_4_,(undefined4)local_338.elemsize);
                m.data = (void *)(local_338.cstep * lVar4 * uVar17 + (long)local_338.data);
                m.refcount._0_4_ = 0;
                m.refcount._4_4_ = 0;
                m.elemsize._0_4_ = (undefined4)local_338.elemsize;
                m.elemsize._4_4_ = local_338.elemsize._4_4_;
                m.elempack = local_338.elempack;
                m.allocator = local_338.allocator;
                m.w = local_338.w;
                m.h = local_338.h;
                m.c = local_338.d;
                m.d = 1;
                m.dims = local_338.dims + -1;
                m.cstep = (uVar17 * (long)local_338.h * (long)local_338.w + 0xf & 0xfffffffffffffff0
                          ) / uVar17;
                if (local_338.dims == 4) {
                  m.cstep = (long)local_338.h * (long)local_338.w;
                }
                uVar17 = CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
                m_1.data = (void *)(local_148.cstep * lVar4 * uVar17 + (long)local_148.data);
                m_1.refcount._0_4_ = 0;
                m_1.refcount._4_4_ = 0;
                m_1.elemsize._0_4_ = (undefined4)local_148.elemsize;
                m_1.elemsize._4_4_ = local_148.elemsize._4_4_;
                m_1.elempack = local_148.elempack;
                m_1.allocator = local_148.allocator;
                m_1.w = local_148.w;
                m_1.h = local_148.h;
                m_1.c = local_148.d;
                m_1.d = 1;
                m_1.dims = local_148.dims + -1;
                m_1.cstep = (uVar17 * (long)local_148.h * (long)local_148.w + 0xf &
                            0xfffffffffffffff0) / uVar17;
                if (local_148.dims == 4) {
                  m_1.cstep = (long)local_148.h * (long)local_148.w;
                }
                local_298.cstep = 0;
                local_298.data = (void *)0x0;
                local_298.refcount._0_4_ = 0;
                local_298.refcount._4_4_ = 0;
                local_298.elemsize._0_4_ = 0;
                local_298.elemsize._4_4_ = 0;
                local_298.elempack = 0;
                local_298.h = 0;
                local_298.d = 0;
                local_298.c = 0;
                local_298.allocator = (Allocator *)0x0;
                local_298.dims = 0;
                local_298.w = 0;
                local_1e8.cstep = 0;
                local_1e8.data = (void *)0x0;
                local_1e8.refcount._0_4_ = 0;
                local_1e8.refcount._4_4_ = 0;
                local_1e8.elemsize._0_4_ = 0;
                local_1e8._20_8_ = 0;
                local_1e8.h = 0;
                local_1e8.d = 0;
                local_1e8.c = 0;
                local_1e8.allocator = (Allocator *)0x0;
                local_1e8.dims = 0;
                local_1e8.w = 0;
                dynamic_quantize_2d_per_h(&m,&local_298,&local_1e8,opt);
                local_2e8.cstep = 0;
                local_2e8.data = (void *)0x0;
                local_2e8.refcount._0_4_ = 0;
                local_2e8.refcount._4_4_ = 0;
                local_2e8.elemsize._0_4_ = 0;
                local_2e8.elemsize._4_4_ = 0;
                local_2e8.elempack = 0;
                local_2e8.h = 0;
                local_2e8.d = 0;
                local_2e8.c = 0;
                local_2e8.allocator = (Allocator *)0x0;
                local_2e8.dims = 0;
                local_2e8.w = 0;
                dynamic_quantize_2d(&m_1,&local_2e8,&xkm_int8_scale,opt);
                for (uVar17 = 0; uVar17 != uVar6; uVar17 = uVar17 + 1) {
                  fVar31 = *(float *)((long)local_1e8.data + uVar17 * 4);
                  pvVar26 = local_2e8.data;
                  for (uVar29 = 0; uVar29 != uVar27; uVar29 = uVar29 + 1) {
                    iVar14 = 0;
                    for (lVar10 = 0; (int)uVar20 != (int)lVar10; lVar10 = lVar10 + 1) {
                      iVar14 = iVar14 + (int)*(char *)((long)pvVar26 + lVar10) *
                                        (int)*(char *)((long)local_298.data +
                                                      lVar10 + CONCAT44(local_298.elemsize._4_4_,
                                                                        (undefined4)
                                                                        local_298.elemsize) * uVar17
                                                               * (long)local_298.w);
                    }
                    *(float *)((long)local_198.data +
                              uVar29 * 4 +
                              local_198.cstep *
                              CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize) *
                              uVar17 + local_198.w * lVar4 *
                                       CONCAT44(local_198.elemsize._4_4_,
                                                (undefined4)local_198.elemsize)) =
                         (float)iVar14 * (1.0 / (fVar31 * xkm_int8_scale));
                    pvVar26 = (void *)((long)pvVar26 +
                                      (long)local_2e8.w *
                                      CONCAT44(local_2e8.elemsize._4_4_,
                                               (undefined4)local_2e8.elemsize));
                  }
                }
                piVar5 = (int *)CONCAT44(local_2e8.refcount._4_4_,local_2e8.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (local_2e8.allocator == (Allocator *)0x0) {
                      free(local_2e8.data);
                    }
                    else {
                      (*(local_2e8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (local_1e8.allocator == (Allocator *)0x0) {
                      free(local_1e8.data);
                    }
                    else {
                      (*(local_1e8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar5 = (int *)CONCAT44(local_298.refcount._4_4_,local_298.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (local_298.allocator == (Allocator *)0x0) {
                      free(local_298.data);
                    }
                    else {
                      (*(local_298.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (m_1.allocator == (Allocator *)0x0) {
                      free(m_1.data);
                    }
                    else {
                      (*(m_1.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                if (piVar5 != (int *)0x0) {
                  LOCK();
                  *piVar5 = *piVar5 + -1;
                  UNLOCK();
                  if (*piVar5 == 0) {
                    if (m.allocator == (Allocator *)0x0) {
                      free(m.data);
                    }
                    else {
                      (*(m.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_3a8 = local_3a8 + local_60;
                local_3a0 = local_3a0 + local_58;
              }
              m.cstep = 0;
              m.data = (void *)0x0;
              m.refcount._0_4_ = 0;
              m.refcount._4_4_ = 0;
              m.elemsize._0_4_ = 0;
              m.elemsize._4_4_ = 0;
              m.elempack = 0;
              m.allocator = (Allocator *)0x0;
              m.dims = 0;
              m.w = 0;
              m.h = 0;
              m.d = 0;
              m.c = 0;
              m_1.cstep = 0;
              m_1.data = (void *)0x0;
              m_1.refcount._0_4_ = 0;
              m_1.refcount._4_4_ = 0;
              m_1.elemsize._0_4_ = 0;
              m_1.elemsize._4_4_ = 0;
              m_1.elempack = 0;
              m_1.allocator = (Allocator *)0x0;
              m_1.dims = 0;
              m_1.w = 0;
              m_1.h = 0;
              m_1.d = 0;
              m_1.c = 0;
              Mat::create(&m,local_198.w,local_198.h,local_198.c,1,1,opt->workspace_allocator);
              Mat::create(&m_1,_h,4,1,opt->workspace_allocator);
              uVar20 = 0;
              uVar27 = (ulong)(uint)(m.h * m.w);
              if (m.h * m.w < 1) {
                uVar27 = uVar20;
              }
              uVar17 = 0;
              if (0 < m.c) {
                uVar17 = (ulong)(uint)m.c;
              }
              pvVar26 = local_198.data;
              for (; uVar20 != uVar17; uVar20 = uVar20 + 1) {
                fVar31 = 0.0;
                for (uVar29 = 0; uVar27 != uVar29; uVar29 = uVar29 + 1) {
                  fVar32 = ABS(*(float *)((long)pvVar26 + uVar29 * 4));
                  if (fVar31 <= fVar32) {
                    fVar31 = fVar32;
                  }
                }
                *(uint *)((long)m_1.data + uVar20 * 4) =
                     -(uint)(fVar31 == 0.0) & 0x3f800000 |
                     ~-(uint)(fVar31 == 0.0) & (uint)(127.0 / fVar31);
                pvVar26 = (void *)((long)pvVar26 +
                                  local_198.cstep *
                                  CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize))
                ;
              }
              for (lVar4 = 0; pvVar19 = local_198.data, pvVar26 = m.data, lVar4 < m.c;
                  lVar4 = lVar4 + 1) {
                lVar7 = m.cstep * CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
                lVar21 = local_198.cstep *
                         CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
                for (lVar10 = 0; lVar10 < (long)m.h * (long)m.w; lVar10 = lVar10 + 1) {
                  fVar31 = roundf(*(float *)((long)m_1.data + lVar4 * 4) *
                                  *(float *)((long)pvVar19 + lVar10 * 4 + lVar21 * lVar4));
                  iVar14 = (int)fVar31;
                  if (iVar14 < -0x7e) {
                    iVar14 = -0x7f;
                  }
                  if (0x7e < iVar14) {
                    iVar14 = 0x7f;
                  }
                  *(char *)((long)pvVar26 + lVar10 + lVar7 * lVar4) = (char)iVar14;
                }
              }
              for (uVar27 = 0; uVar27 != uVar6; uVar27 = uVar27 + 1) {
                iVar14 = local_248->w;
                sVar2 = local_248->elemsize;
                pvVar26 = local_248->data;
                pvVar19 = (this->out_weight_data).data;
                pvVar12 = (this->out_bias_data).data;
                iVar15 = this->embed_dim;
                iVar9 = 0;
                if (0 < iVar15) {
                  iVar9 = iVar15;
                }
                for (uVar20 = 0; uVar20 != uVar28; uVar20 = uVar20 + 1) {
                  iVar13 = 0;
                  for (lVar4 = 0; iVar9 != (int)lVar4; lVar4 = lVar4 + 1) {
                    iVar13 = iVar13 + (int)*(char *)((long)pvVar19 + lVar4) *
                                      (int)*(char *)((long)m.data +
                                                    lVar4 + m.cstep * CONCAT44(m.elemsize._4_4_,
                                                                               (undefined4)
                                                                               m.elemsize) * uVar27)
                    ;
                  }
                  *(float *)((long)pvVar26 + uVar20 * 4 + (long)iVar14 * uVar27 * sVar2) =
                       (float)iVar13 /
                       (*(float *)((long)m_1.data + uVar27 * 4) * this->out_weight_data_int8_scale)
                       + *(float *)((long)pvVar12 + uVar20 * 4);
                  pvVar19 = (void *)((long)pvVar19 + (long)iVar15);
                }
              }
              piVar5 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    free(m_1.data);
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar5 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (m.allocator == (Allocator *)0x0) {
                    free(m.data);
                  }
                  else {
                    (*(m.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar5 = (int *)CONCAT44(local_3f8.refcount._4_4_,local_3f8.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_3f8.allocator == (Allocator *)0x0) {
                    free(local_3f8.data);
                  }
                  else {
                    (*(local_3f8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar5 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_388.allocator == (Allocator *)0x0) {
                    free(local_388.data);
                  }
                  else {
                    (*(local_388.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar5 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  if (local_238.allocator == (Allocator *)0x0) {
                    free(local_238.data);
                  }
                  else {
                    (*(local_238.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              iVar15 = 0;
            }
            piVar5 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
            if (piVar5 != (int *)0x0) {
              LOCK();
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (*piVar5 == 0) {
                if (local_198.allocator == (Allocator *)0x0) {
                  free(local_198.data);
                }
                else {
                  (*(local_198.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar5 = (int *)CONCAT44(local_338.refcount._4_4_,local_338.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_338.allocator == (Allocator *)0x0) {
                free(local_338.data);
              }
              else {
                (*(local_338.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar5 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_148.allocator == (Allocator *)0x0) {
              free(local_148.data);
            }
            else {
              (*(local_148.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_a8.allocator == (Allocator *)0x0) {
            free(local_a8.data);
          }
          else {
            (*(local_a8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          free(local_f8.data);
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (local_4b0 != (int *)0x0) {
    LOCK();
    *local_4b0 = *local_4b0 + -1;
    UNLOCK();
    if (*local_4b0 == 0) {
      if (local_458 == (long *)0x0) {
        free(local_4c8);
      }
      else {
        (**(code **)(*local_458 + 0x18))(local_458,local_4c8);
      }
    }
  }
  return iVar15;
}

Assistant:

int MultiHeadAttention::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;
    const int qdim = weight_data_size / embed_dim;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(qdim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xq.empty())
        return -100;
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xk.empty())
        return -100;
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);
    if (xv.empty())
        return -100;

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xqk.empty())
        return -100;

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);
    if (xqkv.empty())
        return -100;

    // dynamic quantize q_blob
    Mat q_blob_int8;
    float q_blob_int8_scale;
    dynamic_quantize_2d(q_blob, q_blob_int8, q_blob_int8_scale, opt);

    // dynamic quantize k_blob
    Mat k_blob_int8;
    float k_blob_int8_scale;
    if (bottom_blobs.size() == 1)
    {
        k_blob_int8 = q_blob_int8;
        k_blob_int8_scale = q_blob_int8_scale;
    }
    else
    {
        dynamic_quantize_2d(k_blob, k_blob_int8, k_blob_int8_scale, opt);
    }

    // dynamic quantize v_blob
    Mat v_blob_int8;
    float v_blob_int8_scale;
    if (bottom_blobs.size() == 1)
    {
        v_blob_int8 = q_blob_int8;
        v_blob_int8_scale = q_blob_int8_scale;
    }
    else if (bottom_blobs.size() == 2)
    {
        v_blob_int8 = k_blob_int8;
        v_blob_int8_scale = k_blob_int8_scale;
    }
    else
    {
        dynamic_quantize_2d(v_blob, v_blob_int8, v_blob_int8_scale, opt);
    }

    // NCNN_LOGE("%.4f %.4f", q_weight_data_int8_scale, q_blob_int8_scale);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * scale
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const signed char* ptr = q_blob_int8.row<const signed char>(i);
                    const signed char* kptr = (const signed char*)q_weight_data + qdim * (q * embed_dim_per_head + j);

                    int sum = 0;
                    for (int k = 0; k < qdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }
                    const float q_descale = 1.f / (q_weight_data_int8_scales[q * embed_dim_per_head + j] * q_blob_int8_scale);
                    float sum_fp32 = sum * q_descale + q_bias_data[q * embed_dim_per_head + j];

                    outptr[j] = sum_fp32 * scale;
                }
            }
        }

        // xk = affine(k)
        {
            float* outptr = xk.channel(q);

            for (int i = 0; i < k_blob_int8.h; i++)
            {
                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const signed char* ptr = k_blob_int8.row<const signed char>(i);
                    const signed char* kptr = (const signed char*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    int sum = 0;
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }
                    const float k_descale = 1.f / (k_weight_data_int8_scales[q * embed_dim_per_head + j] * k_blob_int8_scale);
                    float sum_fp32 = sum * k_descale + k_bias_data[q * embed_dim_per_head + j];

                    *outptr++ = sum_fp32;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < v_blob_int8.h; j++)
                {
                    const signed char* ptr = v_blob_int8.row<const signed char>(j);
                    const signed char* kptr = (const signed char*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    int sum = 0;
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }
                    const float v_descale = 1.f / (v_weight_data_int8_scales[q * embed_dim_per_head + i] * v_blob_int8_scale);
                    float sum_fp32 = sum * v_descale + v_bias_data[q * embed_dim_per_head + i];

                    *outptr++ = sum_fp32;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            // dynamic quantize xqm per h
            Mat xqm_int8;
            Mat xqm_int8_scales;
            dynamic_quantize_2d_per_h(xqm, xqm_int8, xqm_int8_scales, opt);

            // dynamic quantize xkm
            Mat xkm_int8;
            float xkm_int8_scale;
            dynamic_quantize_2d(xkm, xkm_int8, xkm_int8_scale, opt);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);
                const float xqk_descale = 1.f / (xqm_int8_scales[i] * xkm_int8_scale);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const signed char* qptr = xqm_int8.row<const signed char>(i);
                    const signed char* kptr = xkm_int8.row<const signed char>(j);

                    int sum = 0;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }
                    float sum_fp32 = sum * xqk_descale;

                    outptr[j] = sum_fp32;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            // dynamic quantize xqkm
            Mat xqkm_int8;
            Mat xqkm_int8_scales;
            dynamic_quantize_2d_per_h(xqkm, xqkm_int8, xqkm_int8_scales, opt);

            // dynamic quantize xvm per h
            Mat xvm_int8;
            float xvm_int8_scale;
            dynamic_quantize_2d(xvm, xvm_int8, xvm_int8_scale, opt);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);
                const float xqkv_descale = 1.f / (xqkm_int8_scales[i] * xvm_int8_scale);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const signed char* qkptr = xqkm_int8.row<const signed char>(i);
                    const signed char* vptr = xvm_int8.row<const signed char>(j);

                    int sum = 0;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }
                    float sum_fp32 = sum * xqkv_descale;

                    outptr[j] = sum_fp32;
                }
            }
        }
    }

    // dynamic quantize xqkv
    Mat xqkv_int8;
    Mat xqkv_int8_scales;
    {
        xqkv_int8.create(xqkv.w, xqkv.h, xqkv.c, (size_t)1u, 1, opt.workspace_allocator);
        xqkv_int8_scales.create(src_seqlen, (size_t)4u, 1, opt.workspace_allocator);

        for (int i = 0; i < xqkv_int8.c; i++)
        {
            const float* ptr = xqkv.channel(i);

            float absmax = 0.f;
            for (int j = 0; j < xqkv_int8.w * xqkv_int8.h; j++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[j]));
            }

            xqkv_int8_scales[i] = absmax == 0.f ? 1.f : 127.f / absmax;
        }

        for (int i = 0; i < xqkv_int8.c; i++)
        {
            const float* ptr = xqkv.channel(i);
            signed char* outptr = xqkv_int8.channel(i);

            for (int j = 0; j < xqkv_int8.w * xqkv_int8.h; j++)
            {
                outptr[j] = float2int8(ptr[j] * xqkv_int8_scales[i]);
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < qdim; j++)
        {
            const signed char* ptr = xqkv_int8.channel(i);
            const signed char* kptr = (const signed char*)out_weight_data + embed_dim * j;

            int sum = 0;
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }
            const float out_descale = 1.f / (out_weight_data_int8_scale * xqkv_int8_scales[i]);
            float sum_fp32 = sum * out_descale + out_bias_data[j];

            outptr[j] = sum_fp32;
        }
    }

    return 0;
}